

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testNetworkAdapterList(void)

{
  ushort uVar1;
  NetworkAdapterDesc *pNVar2;
  char *pcVar3;
  NetworkAdapterDesc *pNVar4;
  NetworkAdapterAddress *pNVar5;
  C *pCVar6;
  List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  adapterList;
  SockAddr netMask;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_98;
  List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  local_78;
  NetworkAdapterDesc *local_60;
  sockaddr_in local_58;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  puts("Enumerating adapters...");
  local_78.
  super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  .
  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  .super_ListData<axl::io::NetworkAdapterDesc>.m_head = (NetworkAdapterDesc *)0x0;
  local_78.
  super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  .
  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  .super_ListData<axl::io::NetworkAdapterDesc>.m_tail = (NetworkAdapterDesc *)0x0;
  local_78.
  super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  .
  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  .super_ListData<axl::io::NetworkAdapterDesc>.m_count = 0;
  axl::io::enumerateNetworkAdapters(&local_78);
  printf("%d adapters found.\n",
         local_78.
         super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
         .
         super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
         .super_ListData<axl::io::NetworkAdapterDesc>.m_count);
  if (local_78.
      super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
      .
      super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
      .super_ListData<axl::io::NetworkAdapterDesc>.m_head != (NetworkAdapterDesc *)0x0) {
    pNVar4 = local_78.
             super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
             .
             super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
             .super_ListData<axl::io::NetworkAdapterDesc>.m_head;
    do {
      pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if ((pNVar4->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length !=
          0) {
        pCVar6 = (pNVar4->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
      }
      printf("Name        = %s\n",pCVar6);
      pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if ((pNVar4->m_description).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
          m_length != 0) {
        pCVar6 = (pNVar4->m_description).
                 super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
      }
      printf("Description = %s\n",pCVar6);
      pcVar3 = axl::io::getNetworkAdapterTypeString(pNVar4->m_type);
      printf("Type        = %s\n",pcVar3);
      axl::io::getNetworkAdapterFlagString((String *)&local_98,pNVar4->m_flags);
      pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (CONCAT71(local_98.m_length._1_7_,(undefined1)local_98.m_length) != 0) {
        pCVar6 = local_98.m_p;
      }
      printf("Flags       = %s\n",pCVar6);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
      local_98.m_length._0_1_ = 0;
      local_98.m_length._1_7_ = 0;
      local_98.m_isNullTerminated = false;
      local_98.m_p = (C *)0x0;
      local_98.m_hdr._0_1_ = 0;
      local_98.m_hdr._1_7_ = 0;
      axl::io::getMacAddressString((String *)&local_98,pNVar4->m_macAddress,0);
      pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (CONCAT71(local_98.m_length._1_7_,(undefined1)local_98.m_length) != 0) {
        pCVar6 = local_98.m_p;
      }
      printf("Mac         = %s\n",pCVar6);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
      local_60 = pNVar4;
      for (pNVar5 = (pNVar4->m_addressList).
                    super_OwningListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterAddress>_>
                    .
                    super_ListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>_>
                    .super_ListData<axl::io::NetworkAdapterAddress>.m_head;
          pNVar5 != (NetworkAdapterAddress *)0x0;
          pNVar5 = (NetworkAdapterAddress *)(pNVar5->super_ListLink).m_next) {
        uVar1 = (pNVar5->m_address).field_0.m_addr.sa_family;
        pcVar3 = axl::io::getSockAddrFamilyString((uint)uVar1);
        local_98.m_length._0_1_ = 0;
        local_98.m_length._1_7_ = 0;
        local_98.m_isNullTerminated = false;
        local_98.m_p = (C *)0x0;
        local_98.m_hdr._0_1_ = 0;
        local_98.m_hdr._1_7_ = 0;
        axl::io::getSockAddrString((String *)&local_98,(sockaddr *)&pNVar5->m_address);
        pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        if (CONCAT71(local_98.m_length._1_7_,(undefined1)local_98.m_length) != 0) {
          pCVar6 = local_98.m_p;
        }
        printf("%-11s = %s",pcVar3,pCVar6);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
        if (uVar1 == 2) {
          uStack_48 = 0;
          uStack_44 = 0;
          local_58.sin_family = 0;
          local_58.sin_port = 0;
          local_58.sin_addr.s_addr = 0;
          local_58.sin_zero[0] = '\0';
          local_58.sin_zero[1] = '\0';
          local_58.sin_zero[2] = '\0';
          local_58.sin_zero[3] = '\0';
          local_58.sin_zero[4] = '\0';
          local_58.sin_zero[5] = '\0';
          local_58.sin_zero[6] = '\0';
          local_58.sin_zero[7] = '\0';
          axl::io::createSockAddrNetMask_ip4(&local_58,pNVar5->m_netMaskBitCount);
          local_98.m_length._0_1_ = 0;
          local_98.m_length._1_7_ = 0;
          local_98.m_isNullTerminated = false;
          local_98.m_p = (C *)0x0;
          local_98.m_hdr._0_1_ = 0;
          local_98.m_hdr._1_7_ = 0;
          axl::io::getSockAddrString((String *)&local_98,(sockaddr *)&local_58);
          pCVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
          if (CONCAT71(local_98.m_length._1_7_,(undefined1)local_98.m_length) != 0) {
            pCVar6 = local_98.m_p;
          }
          printf(" (mask %s)\n",pCVar6);
          axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
        }
        else {
          printf("/%d\n",pNVar5->m_netMaskBitCount);
        }
      }
      putchar(10);
      pNVar4 = (NetworkAdapterDesc *)(local_60->super_ListLink).m_next;
    } while (pNVar4 != (NetworkAdapterDesc *)0x0);
  }
  printf("%d adapters found\n",
         local_78.
         super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
         .
         super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
         .super_ListData<axl::io::NetworkAdapterDesc>.m_count);
  pNVar4 = local_78.
           super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
           .
           super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
           .super_ListData<axl::io::NetworkAdapterDesc>.m_head;
  while (pNVar4 != (NetworkAdapterDesc *)0x0) {
    pNVar2 = (NetworkAdapterDesc *)(pNVar4->super_ListLink).m_next;
    axl::mem::Delete<axl::io::NetworkAdapterDesc>::operator()
              ((Delete<axl::io::NetworkAdapterDesc> *)&local_98,pNVar4);
    pNVar4 = pNVar2;
  }
  return;
}

Assistant:

void
testNetworkAdapterList() {
	printf("Enumerating adapters...\n");

	sl::List<io::NetworkAdapterDesc> adapterList;
	io::enumerateNetworkAdapters(&adapterList);

	printf("%d adapters found.\n", adapterList.getCount());

	sl::Iterator<io::NetworkAdapterDesc> adapterIt = adapterList.getHead();
	for (; adapterIt; adapterIt++) {
		io::NetworkAdapterDesc* adapter = *adapterIt;

		printf("Name        = %s\n", adapter->m_name.sz());
		printf("Description = %s\n", adapter->m_description.sz());
		printf("Type        = %s\n", io::getNetworkAdapterTypeString(adapter->m_type));
		printf("Flags       = %s\n", io::getNetworkAdapterFlagString(adapter->m_flags).sz());
		printf("Mac         = %s\n", io::getMacAddressString(adapter->m_macAddress).sz());

		sl::ConstList<io::NetworkAdapterAddress> addressList = adapter->m_addressList;
		sl::ConstIterator<io::NetworkAdapterAddress> addressIt = addressList.getHead();
		for (size_t i = 1; addressIt; addressIt++, i++) {
			const io::NetworkAdapterAddress* address = *addressIt;

			uint_t family = address->m_address.m_addr.sa_family;
			printf("%-11s = %s",
				io::getSockAddrFamilyString(family),
				address->m_address.getString().sz()
			);

			if (family == AF_INET) {
				io::SockAddr netMask;
				netMask.createNetMask_ip4(address->m_netMaskBitCount);
				printf(" (mask %s)\n", netMask.getString().sz());
			} else {
				printf("/%d\n", address->m_netMaskBitCount);
			}
		}

		printf("\n");
	}

	printf("%d adapters found\n", adapterList.getCount());
}